

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexInternalShape.cpp
# Opt level: O1

btVector3 __thiscall
btConvexInternalShape::localGetSupportingVertex(btConvexInternalShape *this,btVector3 *vec)

{
  undefined1 auVar1 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined8 extraout_XMM0_Qa;
  float fVar2;
  undefined8 in_XMM1_Qa;
  undefined8 uVar3;
  undefined8 in_XMM1_Qb;
  undefined1 auVar4 [16];
  uint uVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  btVector3 bVar10;
  float local_28;
  float fStack_24;
  
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0x11])();
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  if ((extraout_XMM0_Da != 0.0) || (uVar3 = extraout_XMM0_Qa, NAN(extraout_XMM0_Da))) {
    fVar9 = vec->m_floats[2];
    fVar6 = vec->m_floats[0];
    fVar8 = vec->m_floats[1];
    fVar2 = fVar9 * fVar9 + fVar6 * fVar6 + fVar8 * fVar8;
    uVar7 = (uint)(fVar2 < 1.4210855e-14);
    uVar5 = (int)(uVar7 << 0x1f) >> 0x1f;
    uVar7 = (int)(uVar7 << 0x1f) >> 0x1f;
    fVar6 = (float)(uVar5 & 0xbf800000 | ~uVar5 & (uint)fVar6);
    fVar8 = (float)(uVar7 & 0xbf800000 | ~uVar7 & (uint)fVar8);
    if (fVar2 < 1.4210855e-14) {
      fVar9 = -1.0;
    }
    fVar2 = fVar9 * fVar9 + fVar6 * fVar6 + fVar8 * fVar8;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar2 = 1.0 / fVar2;
    (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
    local_28 = (float)extraout_XMM0_Qa;
    fStack_24 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
    uVar3 = CONCAT44(fStack_24 + extraout_XMM0_Da_00 * fVar2 * fVar8,
                     local_28 + extraout_XMM0_Da_00 * fVar2 * fVar6);
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_8_ = in_XMM1_Qa;
    auVar4._4_12_ = auVar1._4_12_;
    auVar4._0_4_ = (float)in_XMM1_Qa + fVar2 * fVar9 * extraout_XMM0_Da_00;
    in_XMM1_Qa = auVar4._0_8_;
  }
  bVar10.m_floats[2] = (btScalar)(int)in_XMM1_Qa;
  bVar10.m_floats[3] = (btScalar)(int)((ulong)in_XMM1_Qa >> 0x20);
  bVar10.m_floats[0] = (btScalar)(int)uVar3;
  bVar10.m_floats[1] = (btScalar)(int)((ulong)uVar3 >> 0x20);
  return (btVector3)bVar10.m_floats;
}

Assistant:

btVector3	btConvexInternalShape::localGetSupportingVertex(const btVector3& vec)const
{
#ifndef __SPU__

	 btVector3	supVertex = localGetSupportingVertexWithoutMargin(vec);

	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;

#else
	btAssert(0);
	return btVector3(0,0,0);
#endif //__SPU__

 }